

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__filename;
  char *pcVar2;
  _Alloc_hider __filename_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  FILE *pFVar8;
  FILE *__s;
  FILE *pFVar9;
  size_t i;
  ulong uVar10;
  char *__s_00;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  int EOP;
  uint local_340;
  int top_count;
  int bottom_count;
  int blob_index;
  uint local_330;
  int blob_count;
  FILE *local_328;
  int local_320;
  int typeindex;
  int layer_count;
  int magic;
  char *local_310;
  char *local_308;
  int id;
  int v;
  string parambinpath;
  string include_guard_var;
  char layer_type [33];
  string param_var;
  char layer_name [257];
  char bottom_name [257];
  
  if (argc == 5) {
    pcVar11 = argv[1];
    pcVar1 = argv[2];
    __filename = argv[3];
    pcVar2 = argv[4];
    pcVar7 = strrchr(pcVar11,0x2f);
    __s_00 = pcVar7 + 1;
    if (pcVar7 == (char *)0x0) {
      __s_00 = pcVar11;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)layer_name,__s_00,(allocator<char> *)bottom_name);
    local_308 = pcVar1;
    std::operator+(&parambinpath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)layer_name,
                   ".bin");
    std::__cxx11::string::~string((string *)layer_name);
    __filename_00 = parambinpath._M_dataplus;
    pFVar8 = fopen(pcVar11,"rb");
    __s = fopen(__filename_00._M_p,"wb");
    local_328 = fopen(__filename,"wb");
    path_to_varname_abi_cxx11_(&param_var,pcVar11);
    path_to_varname_abi_cxx11_(&include_guard_var,__filename);
    pFVar9 = local_328;
    fprintf(local_328,"#ifndef NCNN_INCLUDE_GUARD_%s\n",include_guard_var._M_dataplus._M_p);
    fprintf(pFVar9,"#define NCNN_INCLUDE_GUARD_%s\n",include_guard_var._M_dataplus._M_p);
    fprintf(pFVar9,"namespace %s_id {\n",param_var._M_dataplus._M_p);
    magic = 0;
    __isoc99_fscanf(pFVar8,"%d");
    local_310 = pcVar2;
    fwrite(&magic,4,1,__s);
    layer_count = 0;
    blob_count = 0;
    __isoc99_fscanf(pFVar8,"%d %d");
    fwrite(&layer_count,4,1,__s);
    fwrite(&blob_count,4,1,__s);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&layer_names_abi_cxx11_,(long)layer_count);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&blob_names_abi_cxx11_,(long)blob_count);
    blob_index = 0;
    local_330 = 0;
    local_340 = 0;
    while( true ) {
      iVar4 = feof(pFVar8);
      pFVar9 = local_328;
      if (iVar4 != 0) break;
      bottom_count = 0;
      top_count = 0;
      iVar4 = __isoc99_fscanf(pFVar8,"%32s %256s %d %d",layer_type,layer_name,&bottom_count,
                              &top_count);
      if (iVar4 == 4) {
        sanitize_name(layer_name);
        typeindex = ncnn::layer_to_index(layer_type);
        fwrite(&typeindex,4,1,__s);
        fwrite(&bottom_count,4,1,__s);
        fwrite(&top_count,4,1,__s);
        fprintf(local_328,"const int LAYER_%s = %d;\n",layer_name,(ulong)local_340);
        for (iVar4 = 0; iVar4 < bottom_count; iVar4 = iVar4 + 1) {
          iVar5 = __isoc99_fscanf(pFVar8,"%256s",(string *)bottom_name);
          if (iVar5 == 1) {
            local_320 = iVar4;
            sanitize_name(bottom_name);
            lVar13 = 0;
            for (uVar10 = 0;
                uVar10 < (ulong)((long)blob_names_abi_cxx11_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)blob_names_abi_cxx11_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar10 = uVar10 + 1) {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&((blob_names_abi_cxx11_.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar13),bottom_name);
              if (bVar3) goto LAB_00107828;
              lVar13 = lVar13 + 0x20;
            }
            fprintf(_stderr,"find_blob_index_by_name %s failed\n",(string *)bottom_name);
            uVar10 = 0xffffffff;
LAB_00107828:
            id = (int)uVar10;
            fwrite(&id,4,1,__s);
            iVar4 = local_320;
          }
        }
        for (iVar4 = 0; iVar4 < top_count; iVar4 = iVar4 + 1) {
          iVar5 = __isoc99_fscanf(pFVar8,"%256s",(string *)bottom_name);
          if (iVar5 == 1) {
            sanitize_name(bottom_name);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&id,bottom_name,(allocator<char> *)&EOP);
            uVar12 = local_330;
            std::__cxx11::string::operator=
                      ((string *)
                       (blob_names_abi_cxx11_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)local_330),(string *)&id);
            std::__cxx11::string::~string((string *)&id);
            fprintf(local_328,"const int BLOB_%s = %d;\n",(string *)bottom_name,(ulong)uVar12);
            fwrite(&blob_index,4,1,__s);
            blob_index = blob_index + 1;
            local_330 = blob_index;
          }
        }
        id = 0;
        while( true ) {
          iVar4 = __isoc99_fscanf(pFVar8,"%d=",&id);
          if (iVar4 != 1) break;
          fwrite(&id,4,1,__s);
          if (id < -0x5b03) {
            EOP = 0;
            __isoc99_fscanf(pFVar8,"%d",&EOP);
            fwrite(&EOP,4,1,__s);
            for (iVar4 = 0; iVar4 < EOP; iVar4 = iVar4 + 1) {
              __isoc99_fscanf(pFVar8,",%15[^,\n ]",(string *)bottom_name);
              bVar3 = vstr_is_float(bottom_name);
              if (bVar3) {
                pcVar11 = "%f";
              }
              else {
                pcVar11 = "%d";
              }
              __isoc99_sscanf((string *)bottom_name,pcVar11,(allocator<char> *)&v);
              fwrite((allocator<char> *)&v,4,1,__s);
            }
          }
          else {
            __isoc99_fscanf(pFVar8,"%15s",(string *)bottom_name);
            bVar3 = vstr_is_float(bottom_name);
            if (bVar3) {
              pcVar11 = "%f";
            }
            else {
              pcVar11 = "%d";
            }
            __isoc99_sscanf((string *)bottom_name,pcVar11,&EOP);
            fwrite(&EOP,4,1,__s);
          }
        }
        EOP = -0xe9;
        fwrite(&EOP,4,1,__s);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)bottom_name,layer_name,(allocator<char> *)&v);
        uVar12 = local_340;
        std::__cxx11::string::operator=
                  ((string *)
                   (layer_names_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (int)local_340),
                   (string *)bottom_name);
        std::__cxx11::string::~string((string *)bottom_name);
        local_340 = uVar12 + 1;
      }
    }
    fprintf(local_328,"} // namespace %s_id\n",param_var._M_dataplus._M_p);
    fprintf(pFVar9,"#endif // NCNN_INCLUDE_GUARD_%s\n",include_guard_var._M_dataplus._M_p);
    fclose(pFVar8);
    fclose(__s);
    fclose(pFVar9);
    std::__cxx11::string::~string((string *)&include_guard_var);
    std::__cxx11::string::~string((string *)&param_var);
    pcVar11 = local_310;
    pFVar9 = fopen(local_310,"wb");
    path_to_varname_abi_cxx11_((string *)layer_name,parambinpath._M_dataplus._M_p);
    path_to_varname_abi_cxx11_((string *)bottom_name,pcVar11);
    pFVar8 = fopen(parambinpath._M_dataplus._M_p,"rb");
    fprintf(pFVar9,"#ifndef NCNN_INCLUDE_GUARD_%s\n",bottom_name._0_8_);
    fprintf(pFVar9,"#define NCNN_INCLUDE_GUARD_%s\n",bottom_name._0_8_);
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar9);
    fprintf(pFVar9,"static const unsigned char %s[] = {\n",layer_name._0_8_);
    uVar12 = 1;
    while( true ) {
      iVar4 = feof(pFVar8);
      if (iVar4 != 0) break;
      uVar6 = fgetc(pFVar8);
      if (uVar6 == 0xffffffff) break;
      fprintf(pFVar9,"0x%02x,",(ulong)uVar6);
      if ((uVar12 & 0xf) == 0) {
        fputc(10,pFVar9);
      }
      uVar12 = uVar12 + 1;
    }
    fwrite("};\n",3,1,pFVar9);
    fclose(pFVar8);
    pcVar11 = local_308;
    path_to_varname_abi_cxx11_((string *)layer_type,local_308);
    pFVar8 = fopen(pcVar11,"rb");
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar9);
    fprintf(pFVar9,"static const unsigned char %s[] = {\n",layer_type._0_8_);
    uVar12 = 1;
    while( true ) {
      iVar4 = feof(pFVar8);
      if (iVar4 != 0) break;
      uVar6 = fgetc(pFVar8);
      if (uVar6 == 0xffffffff) break;
      fprintf(pFVar9,"0x%02x,",(ulong)uVar6);
      if ((uVar12 & 0xf) == 0) {
        fputc(10,pFVar9);
      }
      uVar12 = uVar12 + 1;
    }
    fwrite("};\n",3,1,pFVar9);
    iVar4 = 0;
    fprintf(pFVar9,"#endif // NCNN_INCLUDE_GUARD_%s\n",bottom_name._0_8_);
    fclose(pFVar8);
    fclose(pFVar9);
    std::__cxx11::string::~string((string *)layer_type);
    std::__cxx11::string::~string((string *)bottom_name);
    std::__cxx11::string::~string((string *)layer_name);
    std::__cxx11::string::~string((string *)&parambinpath);
  }
  else {
    iVar4 = -1;
    fprintf(_stderr,"Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n",*argv);
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 5)
    {
        fprintf(stderr, "Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n", argv[0]);
        return -1;
    }

    const char* parampath = argv[1];
    const char* modelpath = argv[2];
    const char* idcpppath = argv[3];
    const char* memcpppath = argv[4];

    const char* lastslash = strrchr(parampath, '/');
    const char* name = lastslash == NULL ? parampath : lastslash + 1;

    std::string parambinpath = std::string(name) + ".bin";

    dump_param(parampath, parambinpath.c_str(), idcpppath);

    write_memcpp(parambinpath.c_str(), modelpath, memcpppath);

    return 0;
}